

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringNotContains>::operator()
          (Comparator<Corrade::TestSuite::Compare::StringNotContains> *this,StringView actual,
          StringView expectedToNotContain)

{
  bool bVar1;
  Comparator<Corrade::TestSuite::Compare::StringNotContains> *this_local;
  StringView expectedToNotContain_local;
  StringView actual_local;
  
  expectedToNotContain_local._data = (char *)expectedToNotContain._sizePlusFlags;
  actual_local._data = (char *)actual._sizePlusFlags;
  expectedToNotContain_local._sizePlusFlags = (size_t)actual._data;
  (this->_actualValue)._data = (char *)expectedToNotContain_local._sizePlusFlags;
  (this->_actualValue)._sizePlusFlags = (size_t)actual_local._data;
  (this->_expectedToNotContainValue)._data = expectedToNotContain._data;
  (this->_expectedToNotContainValue)._sizePlusFlags = (size_t)expectedToNotContain_local._data;
  bVar1 = Containers::BasicStringView<const_char>::contains
                    ((BasicStringView<const_char> *)&expectedToNotContain_local._sizePlusFlags,
                     expectedToNotContain);
  if (bVar1) {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&actual_local._sizePlusFlags + 7),Failed);
  }
  else {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&actual_local._sizePlusFlags + 7),Verbose);
  }
  return (ComparisonStatusFlags)actual_local._sizePlusFlags._7_1_;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::StringNotContains>::operator()(const Containers::StringView actual, const Containers::StringView expectedToNotContain) {
    _actualValue = actual;
    _expectedToNotContainValue = expectedToNotContain;

    /* Unlike the other comparators, here it can't pass if the strings are the
       same, meaning we report the verbose message always */
    if(actual.contains(expectedToNotContain)) return ComparisonStatusFlag::Failed;
    return ComparisonStatusFlag::Verbose;
}